

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int Cec_GiaSplitTestInt(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose
                       ,int fVeryVerbose,int fSilent)

{
  int nVars;
  int nConfs;
  int fStatus;
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int nIter_00;
  uint uVar7;
  uint uVar8;
  abctime aVar9;
  Cnf_Dat_t *p_00;
  Gia_Man_t *pGVar10;
  Vec_Int_t *pVVar11;
  void *pvVar12;
  double dVar13;
  int local_1374;
  Gia_Man_t *pPart;
  int iVar;
  int Cost;
  int nFanouts;
  int Depth;
  Gia_Man_t *pLast;
  int local_1328;
  int fWorkToDo;
  int RetValue;
  int nIter;
  int nSatConfs;
  int nSatVars;
  int status;
  int i;
  double Progress;
  Cnf_Dat_t *pCnf;
  Vec_Ptr_t *vStack;
  pthread_t WorkerThread [100];
  Par_ThData_t_conflict ThData [100];
  abctime clkTotal;
  int fVerbose_local;
  int LookAhead_local;
  int nIterMax_local;
  int nTimeOut_local;
  int nProcs_local;
  Gia_Man_t *p_local;
  
  ThData[99]._32_8_ = Abc_Clock();
  _status = 0.0;
  fWorkToDo = 0;
  local_1328 = -1;
  pLast._4_4_ = 1;
  Abc_CexFreeP(&p->pCexComb);
  if (fVerbose != 0) {
    printf("Solving CEC problem by cofactoring with the following parameters:\n");
    printf("Processes = %d   TimeOut = %d sec   MaxIter = %d   LookAhead = %d   Verbose = %d.\n",
           (ulong)(uint)nProcs,(ulong)(uint)nTimeOut,(ulong)(uint)nIterMax,(ulong)(uint)LookAhead,
           (ulong)(uint)fVerbose);
  }
  fflush(_stdout);
  if (nProcs == 1) {
    p_local._4_4_ = Cec_GiaSplitTest2(p,1,nTimeOut,nIterMax,LookAhead,fVerbose,fVeryVerbose,fSilent)
    ;
  }
  else {
    iVar5 = nProcs + -1;
    if ((iVar5 < 1) || (100 < iVar5)) {
      __assert_fail("nProcs >= 1 && nProcs <= PAR_THR_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                    ,0x250,"int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)"
                   );
    }
    Progress = (double)Cec_GiaDeriveGiaRemapped(p);
    nSatConfs = Cnf_GiaSolveOne(p,(Cnf_Dat_t *)Progress,nTimeOut,&nIter,&RetValue);
    Cnf_DataFree((Cnf_Dat_t *)Progress);
    dVar13 = _status;
    iVar6 = nSatConfs;
    if ((fVerbose != 0) && (nSatConfs != -1)) {
      aVar9 = Abc_Clock();
      Cec_GiaSplitPrint(0,0,nIter,RetValue,iVar6,dVar13,aVar9 - ThData[99]._32_8_);
    }
    if (nSatConfs == 0) {
      if (fSilent == 0) {
        printf("The problem is SAT without cofactoring.\n");
      }
      p_local._4_4_ = 0;
    }
    else if (nSatConfs == 1) {
      if (fSilent == 0) {
        printf("The problem is UNSAT without cofactoring.\n");
      }
      p_local._4_4_ = 1;
    }
    else {
      if (nSatConfs != -1) {
        __assert_fail("status == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                      ,0x263,
                      "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      p_00 = (Cnf_Dat_t *)Vec_PtrAlloc(1000);
      pCnf = p_00;
      pGVar10 = Gia_ManDup(p);
      Vec_PtrPush((Vec_Ptr_t *)p_00,pGVar10);
      for (nSatVars = 0; nSatVars < iVar5; nSatVars = nSatVars + 1) {
        ThData[(long)nSatVars + -1].nVars = 0;
        ThData[(long)nSatVars + -1].nConfs = 0;
        ThData[nSatVars].p = (Gia_Man_t *)0x0;
        *(int *)&ThData[nSatVars].pCnf = nSatVars;
        *(int *)((long)&ThData[nSatVars].pCnf + 4) = nTimeOut;
        ThData[nSatVars].iThread = 0;
        ThData[nSatVars].nTimeOut = -1;
        ThData[nSatVars].fWorking = -1;
        ThData[nSatVars].Result = -1;
        nSatConfs = pthread_create(WorkerThread + (long)nSatVars + -1,(pthread_attr_t *)0x0,
                                   Cec_GiaSplitWorkerThread,&ThData[(long)nSatVars + -1].nVars);
        if (nSatConfs != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                        ,0x272,
                        "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
        }
        nSatConfs = 0;
      }
      while (pLast._4_4_ != 0) {
        iVar6 = Vec_PtrSize((Vec_Ptr_t *)pCnf);
        pLast._4_4_ = (uint)(0 < iVar6);
        for (nSatVars = 0; nSatVars < iVar5; nSatVars = nSatVars + 1) {
          if (ThData[nSatVars].iThread == 0) {
            lVar1._0_4_ = ThData[(long)nSatVars + -1].nVars;
            lVar1._4_4_ = ThData[(long)nSatVars + -1].nConfs;
            if (lVar1 != 0) {
              _nFanouts = *(Gia_Man_t **)&ThData[(long)nSatVars + -1].nVars;
              if (_nFanouts->vCofVars == (Vec_Int_t *)0x0) {
                local_1374 = 0;
              }
              else {
                local_1374 = Vec_IntSize(_nFanouts->vCofVars);
              }
              Cost = local_1374;
              if (_nFanouts->vCofVars == (Vec_Int_t *)0x0) {
                pVVar11 = Vec_IntAlloc(100);
                _nFanouts->vCofVars = pVVar11;
              }
              dVar13 = _status;
              iVar6 = Cost;
              if (fVerbose != 0) {
                nIter_00 = nSatVars + 1;
                nVars = ThData[nSatVars].fWorking;
                nConfs = ThData[nSatVars].Result;
                fStatus = ThData[nSatVars].nTimeOut;
                aVar9 = Abc_Clock();
                Cec_GiaSplitPrint(nIter_00,iVar6,nVars,nConfs,fStatus,dVar13,
                                  aVar9 - ThData[99]._32_8_);
              }
              if (ThData[nSatVars].nTimeOut == 0) {
                p->pCexComb = _nFanouts->pCexComb;
                _nFanouts->pCexComb = (Abc_Cex_t *)0x0;
                local_1328 = 0;
                goto LAB_0080a193;
              }
              if (ThData[nSatVars].nTimeOut == -1) {
                pPart._0_4_ = Gia_SplitCofVar(_nFanouts,LookAhead,&iVar,(int *)((long)&pPart + 4));
                pGVar10 = Gia_ManDupCofactorVar(_nFanouts,(uint)pPart,0);
                iVar6 = Vec_IntSize(_nFanouts->vCofVars);
                pVVar11 = Vec_IntAlloc(iVar6 + 1);
                pGVar10->vCofVars = pVVar11;
                Vec_IntAppend(pGVar10->vCofVars,_nFanouts->vCofVars);
                pVVar11 = pGVar10->vCofVars;
                iVar6 = Abc_Var2Lit((uint)pPart,1);
                Vec_IntPush(pVVar11,iVar6);
                Vec_PtrPush((Vec_Ptr_t *)pCnf,pGVar10);
                iVar6 = iVar;
                uVar4 = pPart._4_4_;
                uVar3 = (uint)pPart;
                if (fVeryVerbose != 0) {
                  uVar7 = Gia_ManAndNum(_nFanouts);
                  uVar8 = Gia_ManAndNum(pGVar10);
                  printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n"
                         ,(ulong)uVar3,(ulong)(uint)iVar6,(ulong)uVar4,(ulong)uVar7,(ulong)uVar8);
                }
                pGVar10 = Gia_ManDupCofactorVar(_nFanouts,(uint)pPart,1);
                iVar6 = Vec_IntSize(_nFanouts->vCofVars);
                pVVar11 = Vec_IntAlloc(iVar6 + 1);
                pGVar10->vCofVars = pVVar11;
                Vec_IntAppend(pGVar10->vCofVars,_nFanouts->vCofVars);
                pVVar11 = pGVar10->vCofVars;
                iVar6 = Abc_Var2Lit((uint)pPart,1);
                Vec_IntPush(pVVar11,iVar6);
                Vec_PtrPush((Vec_Ptr_t *)pCnf,pGVar10);
                pLast._4_4_ = 1;
                fWorkToDo = fWorkToDo + 1;
              }
              else {
                dVar13 = pow(2.0,(double)Cost);
                _status = 1.0 / dVar13 + _status;
              }
              Gia_ManStopP((Gia_Man_t **)&ThData[(long)nSatVars + -1].nVars);
              if (ThData[nSatVars].p == (Gia_Man_t *)0x0) goto LAB_0080a152;
              Cnf_DataFree((Cnf_Dat_t *)ThData[nSatVars].p);
              ThData[nSatVars].p = (Gia_Man_t *)0x0;
            }
            iVar6 = Vec_PtrSize((Vec_Ptr_t *)pCnf);
            if (iVar6 != 0) {
              lVar2._0_4_ = ThData[(long)nSatVars + -1].nVars;
              lVar2._4_4_ = ThData[(long)nSatVars + -1].nConfs;
              if (lVar2 != 0) {
                __assert_fail("ThData[i].p == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                              ,0x2b6,
                              "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)"
                             );
              }
              pvVar12 = Vec_PtrPop((Vec_Ptr_t *)pCnf);
              *(void **)&ThData[(long)nSatVars + -1].nVars = pvVar12;
              pGVar10 = (Gia_Man_t *)
                        Cec_GiaDeriveGiaRemapped(*(Gia_Man_t **)&ThData[(long)nSatVars + -1].nVars);
              ThData[nSatVars].p = pGVar10;
              ThData[nSatVars].iThread = 1;
            }
          }
          else {
            pLast._4_4_ = 1;
          }
LAB_0080a152:
        }
        if ((nIterMax != 0) && (nIterMax <= fWorkToDo)) break;
      }
      if (pLast._4_4_ == 0) {
        local_1328 = 1;
      }
LAB_0080a193:
      for (nSatVars = 0; nSatVars < iVar5; nSatVars = nSatVars + 1) {
        if (ThData[nSatVars].iThread != 0) {
          nSatVars = 0;
        }
      }
      for (nSatVars = 0; nSatVars < iVar5; nSatVars = nSatVars + 1) {
        if (ThData[nSatVars].iThread != 0) {
          __assert_fail("!ThData[i].fWorking",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                        ,0x2c8,
                        "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
        }
        Gia_ManStopP((Gia_Man_t **)&ThData[(long)nSatVars + -1].nVars);
        if (ThData[nSatVars].p != (Gia_Man_t *)0x0) {
          Cnf_DataFree((Cnf_Dat_t *)ThData[nSatVars].p);
          ThData[nSatVars].p = (Gia_Man_t *)0x0;
          ThData[(long)nSatVars + -1].nVars = 0;
          ThData[(long)nSatVars + -1].nConfs = 0;
          ThData[nSatVars].iThread = 1;
        }
      }
      Cec_GiaSplitClean((Vec_Ptr_t *)pCnf);
      if (fSilent == 0) {
        if (local_1328 == 0) {
          printf("Problem is SAT ");
        }
        else if (local_1328 == 1) {
          printf("Problem is UNSAT ");
        }
        else {
          if (local_1328 != -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                          ,0x2dd,
                          "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)")
            ;
          }
          printf("Problem is UNDECIDED ");
        }
        printf("after %d case-splits.  ",(ulong)(uint)fWorkToDo);
        aVar9 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar9 - ThData[99]._32_8_);
        fflush(_stdout);
      }
      p_local._4_4_ = local_1328;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cec_GiaSplitTestInt( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Par_ThData_t ThData[PAR_THR_MAX];
    pthread_t WorkerThread[PAR_THR_MAX];
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    double Progress = 0;
    int i, status, nSatVars, nSatConfs;
    int nIter = 0, RetValue = -1, fWorkToDo = 1;
    Abc_CexFreeP( &p->pCexComb );
    if ( fVerbose )
        printf( "Solving CEC problem by cofactoring with the following parameters:\n" );
    if ( fVerbose )
        printf( "Processes = %d   TimeOut = %d sec   MaxIter = %d   LookAhead = %d   Verbose = %d.\n", nProcs, nTimeOut, nIterMax, LookAhead, fVerbose );
    fflush( stdout );
    if ( nProcs == 1 )
        return Cec_GiaSplitTest2( p, nProcs, nTimeOut, nIterMax, LookAhead, fVerbose, fVeryVerbose, fSilent );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= PAR_THR_MAX );
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose && status != -1 )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
        if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
        if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p        = NULL;
        ThData[i].pCnf     = NULL;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = nTimeOut;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        ThData[i].nVars    = -1;
        ThData[i].nConfs   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cec_GiaSplitWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].p != NULL )
            {
                Gia_Man_t * pLast = ThData[i].p;
                int Depth = pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0;
                if ( pLast->vCofVars == NULL )
                    pLast->vCofVars = Vec_IntAlloc( 100 );
                if ( fVerbose )
                    Cec_GiaSplitPrint( i+1, Depth, ThData[i].nVars, ThData[i].nConfs, ThData[i].Result, Progress, Abc_Clock() - clkTotal );
                if ( ThData[i].Result == 0 ) // SAT
                {
                    p->pCexComb = pLast->pCexComb;  pLast->pCexComb = NULL;
                    RetValue = 0;
                    goto finish;
                }
                if ( ThData[i].Result == -1 ) // UNDEC
                {
                    // determine cofactoring variable
                    int nFanouts, Cost, iVar = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
                    // cofactor
                    Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
                    pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
                    Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
                    Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
                    Vec_PtrPush( vStack, pPart );
                    // print results
                    if ( fVeryVerbose )
                    {
//                        Cec_GiaSplitPrintRefs( pLast );
                        printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                            iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//                        Cec_GiaSplitPrintRefs( pPart );
                    }
                    // cofactor
                    pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
                    pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
                    Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
                    Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
                    Vec_PtrPush( vStack, pPart );
                    // keep working
                    fWorkToDo = 1;
                    nIter++;
                }
                else
                    Progress += 1.0 / pow((double)2, (double)Depth);
                Gia_ManStopP( &ThData[i].p );
                if ( ThData[i].pCnf == NULL )
                    continue;
                Cnf_DataFree( ThData[i].pCnf );
                ThData[i].pCnf = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // start a new thread
            assert( ThData[i].p == NULL );
            ThData[i].p = (Gia_Man_t*)Vec_PtrPop( vStack );
            ThData[i].pCnf = Cec_GiaDeriveGiaRemapped( ThData[i].p );
            ThData[i].fWorking = 1;
        }
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( !fWorkToDo )
        RetValue = 1;
finish:
    // wait till threads finish
    for ( i = 0; i < nProcs; i++ )
        if ( ThData[i].fWorking )
            i = 0;
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // cleanup
        Gia_ManStopP( &ThData[i].p );
        if ( ThData[i].pCnf == NULL )
            continue;
        Cnf_DataFree( ThData[i].pCnf );
        ThData[i].pCnf = NULL;
        // stop
        ThData[i].p = NULL;
        ThData[i].fWorking = 1;
    }
    // finish
    Cec_GiaSplitClean( vStack );
    if ( !fSilent )
    {
        if ( RetValue == 0 )
            printf( "Problem is SAT " );
        else if ( RetValue == 1 )
            printf( "Problem is UNSAT " );
        else if ( RetValue == -1 )
            printf( "Problem is UNDECIDED " );
        else assert( 0 );
        printf( "after %d case-splits.  ", nIter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        fflush( stdout );
    }
    return RetValue;
}